

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

string * __thiscall
testing::internal::MatchMatrix::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MatchMatrix *this)

{
  bool bVar1;
  size_t sVar2;
  ulong local_1c8;
  size_t j;
  ulong local_1b0;
  size_t i;
  char *sep;
  stringstream ss;
  ostream local_190 [376];
  MatchMatrix *local_18;
  MatchMatrix *this_local;
  
  local_18 = this;
  this_local = (MatchMatrix *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&sep);
  i = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_1b0 = 0;
  while( true ) {
    sVar2 = LhsSize(this);
    if (sVar2 <= local_1b0) break;
    std::operator<<(local_190,(char *)i);
    local_1c8 = 0;
    while( true ) {
      sVar2 = RhsSize(this);
      if (sVar2 <= local_1c8) break;
      bVar1 = HasEdge(this,local_1b0,local_1c8);
      std::ostream::operator<<(local_190,bVar1);
      local_1c8 = local_1c8 + 1;
    }
    i = (long)"&amp;" + 4;
    local_1b0 = local_1b0 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&sep);
  return __return_storage_ptr__;
}

Assistant:

string MatchMatrix::DebugString() const {
  ::std::stringstream ss;
  const char *sep = "";
  for (size_t i = 0; i < LhsSize(); ++i) {
    ss << sep;
    for (size_t j = 0; j < RhsSize(); ++j) {
      ss << HasEdge(i, j);
    }
    sep = ";";
  }
  return ss.str();
}